

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O3

void ourWriteOut(char *writeinfo,per_transfer *per,CURLcode per_result)

{
  byte bVar1;
  char cVar2;
  writeoutid wVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  writeoutvar *pwVar11;
  int __c;
  FILE *__stream;
  byte *pbVar12;
  
  __stream = _stdout;
  if (writeinfo == (char *)0x0) {
    return;
  }
LAB_0011bdc9:
  bVar6 = *writeinfo;
  if (bVar6 == 0) {
    return;
  }
  writeinfo = (char *)((byte *)writeinfo + 1);
  while (bVar6 == 0x25) {
    bVar1 = *writeinfo;
    if (bVar1 != 0x7b) {
      if (bVar1 == 0) goto LAB_0011be6f;
      __c = 0x25;
      iVar7 = 0x25;
      if (bVar1 != 0x25) goto LAB_0011be27;
      goto LAB_0011be34;
    }
    pcVar8 = strchr((char *)((byte *)writeinfo + -1),0x7d);
    if (pcVar8 != (char *)0x0) {
      cVar2 = *pcVar8;
      *pcVar8 = '\0';
      pbVar12 = (byte *)writeinfo + 1;
      iVar7 = curl_strequal(pbVar12,"content_type");
      pwVar11 = variables;
      if (iVar7 != 0) goto LAB_0011beee;
      lVar5 = 0;
      goto LAB_0011beb8;
    }
    fputs("%{",__stream);
    bVar6 = ((byte *)writeinfo)[1];
    writeinfo = (char *)((byte *)writeinfo + 2);
    if (bVar6 == 0) {
      return;
    }
  }
  if (bVar6 == 0x5c) {
    bVar6 = *writeinfo;
    if (bVar6 < 0x72) {
      if (bVar6 == 0) {
        iVar7 = 0x5c;
        goto LAB_0011be72;
      }
      if (bVar6 == 0x6e) {
        __c = 10;
      }
      else {
LAB_0011bf3d:
        iVar7 = 0x5c;
LAB_0011be27:
        fputc(iVar7,__stream);
        __c = (int)*writeinfo;
      }
    }
    else if (bVar6 == 0x72) {
      __c = 0xd;
    }
    else {
      if (bVar6 != 0x74) goto LAB_0011bf3d;
      __c = 9;
    }
LAB_0011be34:
    fputc(__c,__stream);
    writeinfo = (char *)((byte *)writeinfo + 1);
  }
  else {
LAB_0011be6f:
    iVar7 = (int)(char)bVar6;
LAB_0011be72:
    fputc(iVar7,__stream);
  }
  bVar4 = false;
  goto LAB_0011be7c;
  while (iVar7 = curl_strequal(pbVar12,*(undefined8 *)((long)&variables[1].name + lVar10)),
        lVar5 = lVar10 + 0x18, iVar7 == 0) {
LAB_0011beb8:
    lVar10 = lVar5;
    if (lVar10 + 0x18 == 0x3f0) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",pbVar12);
      bVar4 = false;
      goto LAB_0011bfc8;
    }
  }
  pwVar11 = (writeoutvar *)(lVar10 + 0x12c928);
LAB_0011beee:
  wVar3 = pwVar11->id;
  if ((int)wVar3 < 0x26) {
    if (wVar3 == VAR_JSON) {
      ourWriteOutJSON((FILE *)__stream,variables,per,per_result);
      bVar4 = false;
      goto LAB_0011bfc8;
    }
    bVar4 = per_result == CURLE_OK;
    if (wVar3 == VAR_ONERROR) goto LAB_0011bfc8;
LAB_0011bf7a:
    (*pwVar11->writefunc)((FILE *)__stream,pwVar11,per,per_result,false);
    bVar4 = false;
  }
  else {
    if (wVar3 == VAR_STDERR) {
      puVar9 = (undefined8 *)&stderr;
    }
    else {
      if (wVar3 != VAR_STDOUT) goto LAB_0011bf7a;
      puVar9 = (undefined8 *)&stdout;
    }
    __stream = (FILE *)*puVar9;
    bVar4 = false;
  }
LAB_0011bfc8:
  writeinfo = pcVar8 + 1;
  *pcVar8 = cVar2;
LAB_0011be7c:
  if (bVar4) {
    return;
  }
  goto LAB_0011bdc9;
}

Assistant:

void ourWriteOut(const char *writeinfo, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  bool done = FALSE;

  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* null-terminate */
          for(i = 0; variables[i].name; i++) {
            if(curl_strequal(ptr, variables[i].name)) {
              match = TRUE;
              switch(variables[i].id) {
              case VAR_ONERROR:
                if(per_result == CURLE_OK)
                  /* this isn't error so skip the rest */
                  done = TRUE;
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              case VAR_JSON:
                ourWriteOutJSON(stream, variables, per, per_result);
                break;
              default:
                (void)variables[i].writefunc(stream, &variables[i],
                                             per, per_result, false);
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
}